

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCacheHandler.cpp
# Opt level: O0

void __thiscall irr::video::COpenGLCacheHandler::setAlphaTest(COpenGLCacheHandler *this,bool enable)

{
  byte bVar1;
  byte in_SIL;
  long in_RDI;
  
  bVar1 = in_SIL & 1;
  if ((*(byte *)(in_RDI + 200) & 1) != bVar1) {
    if (bVar1 == 0) {
      glDisable(0xbc0);
    }
    else {
      glEnable(0xbc0);
    }
    *(byte *)(in_RDI + 200) = bVar1;
  }
  return;
}

Assistant:

void COpenGLCacheHandler::setAlphaTest(bool enable)
{
	if (AlphaTest != enable) {
		if (enable)
			glEnable(GL_ALPHA_TEST);
		else
			glDisable(GL_ALPHA_TEST);
		AlphaTest = enable;
	}
}